

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elg.c
# Opt level: O0

void i2p_elg_keygen(i2p_elg *elg)

{
  BN_CTX *ctx_00;
  BIGNUM *ret;
  BIGNUM *a;
  BIGNUM *ret_00;
  BIGNUM *in_RDI;
  BIGNUM *elgp;
  BIGNUM *elgg;
  BIGNUM *p;
  BN_CTX *ctx;
  
  RAND_bytes((uchar *)in_RDI,0x100);
  ctx_00 = BN_CTX_new();
  ret = BN_new();
  a = BN_new();
  ret_00 = BN_new();
  BN_bin2bn(elgp_,0x100,ret_00);
  BN_set_word(a,2);
  BN_bin2bn((uchar *)in_RDI,0x100,ret);
  BN_mod_exp(ret,a,ret,ret_00,ctx_00);
  bn2buf(in_RDI,(uint8_t *)ctx_00,(size_t)ret);
  BN_free(ret);
  BN_free(a);
  BN_free(ret_00);
  BN_CTX_free(ctx_00);
  return;
}

Assistant:

void i2p_elg_keygen(struct i2p_elg * elg)
{
 
  RAND_bytes (elg->priv, 256);
  BN_CTX * ctx = BN_CTX_new ();
  BIGNUM * p = BN_new ();
  BIGNUM * elgg = BN_new ();
  BIGNUM * elgp = BN_new ();
  BN_bin2bn (elgp_, 256, elgp);
  BN_set_word(elgg, elgg_);
  BN_bin2bn (elg->priv, 256, p);
  BN_mod_exp (p, elgg, p, elgp, ctx);
  bn2buf (p, elg->pub, 256);
  BN_free (p);
  BN_free (elgg);
  BN_free (elgp);
  BN_CTX_free (ctx);
}